

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::PoolingLayerParams::Clear(PoolingLayerParams *this)

{
  uint32_t cached_has_bits;
  PoolingLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->stride_);
  memset(&this->type_,0,6);
  clear_PoolingPaddingType(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void PoolingLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.PoolingLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  kernelsize_.Clear();
  stride_.Clear();
  ::memset(&type_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&globalpooling_) -
      reinterpret_cast<char*>(&type_)) + sizeof(globalpooling_));
  clear_PoolingPaddingType();
  _internal_metadata_.Clear<std::string>();
}